

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_insert(lua_State *L,int idx)

{
  StkId pTVar1;
  TValue *pTVar2;
  TValue *o1_1;
  TValue *o2_1;
  TValue *o1;
  TValue *o2;
  StkId q;
  StkId p;
  int idx_local;
  lua_State *L_local;
  
  pTVar2 = index2adr(L,idx);
  for (o2 = L->top; pTVar2 < o2; o2 = o2 + -1) {
    o2->value = o2[-1].value;
    o2->tt = o2[-1].tt;
  }
  pTVar1 = L->top;
  pTVar2->value = pTVar1->value;
  pTVar2->tt = pTVar1->tt;
  return;
}

Assistant:

LUA_API void lua_insert (lua_State *L, int idx) {
  StkId p;
  StkId q;
  lua_lock(L);
  p = index2adr(L, idx);
  api_checkvalidindex(L, p);
  for (q = L->top; q>p; q--) setobjs2s(L, q, q-1);
  setobjs2s(L, p, L->top);
  lua_unlock(L);
}